

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O3

void __thiscall
nonstd::optional_lite::optional<std::__cxx11::string>::initialize<std::__cxx11::string>
          (optional<std::__cxx11::string> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  
  if (*this != (optional<std::__cxx11::string>)0x1) {
    *(optional<std::__cxx11::string> **)(this + 8) = this + 0x18;
    pcVar2 = (value->_M_dataplus)._M_p;
    paVar1 = &value->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 == paVar1) {
      uVar3 = *(undefined8 *)((long)&value->field_2 + 8);
      *(size_type *)(this + 0x18) = paVar1->_M_allocated_capacity;
      *(undefined8 *)(this + 0x20) = uVar3;
    }
    else {
      *(pointer *)(this + 8) = pcVar2;
      *(size_type *)(this + 0x18) = paVar1->_M_allocated_capacity;
    }
    *(size_type *)(this + 0x10) = value->_M_string_length;
    (value->_M_dataplus)._M_p = (pointer)paVar1;
    value->_M_string_length = 0;
    (value->field_2)._M_local_buf[0] = '\0';
    *this = (optional<std::__cxx11::string>)0x1;
    return;
  }
  __assert_fail("! has_value()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/TartanLlama[P]elfheadedit/optional.hpp"
                ,0x354,
                "void nonstd::optional_lite::optional<std::basic_string<char>>::initialize(V &&) [T = std::basic_string<char>, V = std::basic_string<char>]"
               );
}

Assistant:

void initialize( V && value )
    {
        assert( ! has_value()  );
        contained.construct_value( std::move( value ) );
        has_value_ = true;
    }